

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

CAmount wallet::GetCachableAmount
                  (CWallet *wallet,CWalletTx *wtx,AmountType type,isminefilter *filter)

{
  long lVar1;
  bool bVar2;
  uint *in_RCX;
  ulong uVar3;
  uint in_EDX;
  CWallet *in_RSI;
  CachableAmount *in_RDI;
  long in_FS_OFFSET;
  CachableAmount *amount;
  reference *in_stack_ffffffffffffff88;
  bitset<8UL> *in_stack_ffffffffffffff90;
  isminefilter filter_00;
  CachableAmount *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffd0;
  CWallet *wallet_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (ulong)in_EDX;
  wallet_00 = in_RSI;
  std::bitset<8UL>::operator[](in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
  filter_00 = (isminefilter)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffff98);
  std::bitset<8UL>::reference::~reference(in_stack_ffffffffffffff88);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    if (in_EDX == 0) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )in_stack_ffffffffffffff98);
      CWallet::GetDebit(wallet_00,(CTransaction *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RCX)
      ;
      in_RDI = in_stack_ffffffffffffff98;
    }
    else {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )in_RDI);
      TxGetCredit(wallet_00,(CTransaction *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RCX);
    }
    CachableAmount::Set(in_RDI,filter_00,(CAmount)in_stack_ffffffffffffff88);
    *(undefined1 *)&(wallet_00->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return *(CAmount *)
          ((long)&in_RSI->m_last_block_processed + (ulong)*in_RCX * 8 + uVar3 * 0x48 + -0x78);
}

Assistant:

static CAmount GetCachableAmount(const CWallet& wallet, const CWalletTx& wtx, CWalletTx::AmountType type, const isminefilter& filter)
{
    auto& amount = wtx.m_amounts[type];
    if (!amount.m_cached[filter]) {
        amount.Set(filter, type == CWalletTx::DEBIT ? wallet.GetDebit(*wtx.tx, filter) : TxGetCredit(wallet, *wtx.tx, filter));
        wtx.m_is_cache_empty = false;
    }
    return amount.m_value[filter];
}